

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O2

int Abc_NodeMffcSize(Abc_Obj_t *pNode)

{
  uint __line;
  int iVar1;
  int iVar2;
  char *__assertion;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    if ((pNode->vFanins).nSize == 0) {
      return 0;
    }
    iVar1 = Abc_NodeRefDeref(pNode,0,0);
    iVar2 = Abc_NodeRefDeref(pNode,1,0);
    if (iVar1 == iVar2) {
      if (0 < iVar1) {
        return iVar1;
      }
      __assertion = "nConeSize1 > 0";
      __line = 0x3b;
    }
    else {
      __assertion = "nConeSize1 == nConeSize2";
      __line = 0x3a;
    }
  }
  else {
    __assertion = "Abc_ObjIsNode( pNode )";
    __line = 0x35;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcRefs.c"
                ,__line,"int Abc_NodeMffcSize(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeMffcSize( Abc_Obj_t * pNode )
{
    int nConeSize1, nConeSize2;
//    assert( Abc_NtkIsStrash(pNode->pNtk) );
//    assert( !Abc_ObjIsComplement( pNode ) );
    assert( Abc_ObjIsNode( pNode ) );
    if ( Abc_ObjFaninNum(pNode) == 0 )
        return 0;
    nConeSize1 = Abc_NodeRefDeref( pNode, 0, 0 ); // dereference
    nConeSize2 = Abc_NodeRefDeref( pNode, 1, 0 ); // reference
    assert( nConeSize1 == nConeSize2 );
    assert( nConeSize1 > 0 );
    return nConeSize1;
}